

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O3

void __thiscall
TEST_PluginTest_ActionsAllRun_Test::testBody(TEST_PluginTest_ActionsAllRun_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *pcVar4;
  char *pcVar5;
  SimpleString SStack_48;
  SimpleString local_38;
  
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin
                   ).field_0x24;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x89,pTVar3);
  }
  else {
    StringFrom((int)&local_38);
    pcVar4 = SimpleString::asCharString(&local_38);
    StringFrom((int)&SStack_48);
    pcVar5 = SimpleString::asCharString(&SStack_48);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x89,pTVar3);
    SimpleString::~SimpleString(&SStack_48);
    SimpleString::~SimpleString(&local_38);
  }
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postAction;
  pUVar2 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x8a,pTVar3);
  }
  else {
    StringFrom((int)&local_38);
    pcVar4 = SimpleString::asCharString(&local_38);
    StringFrom((int)&SStack_48);
    pcVar5 = SimpleString::asCharString(&SStack_48);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x8a,pTVar3);
    SimpleString::~SimpleString(&SStack_48);
    SimpleString::~SimpleString(&local_38);
  }
  return;
}

Assistant:

TEST(PluginTest, ActionsAllRun)
{
    genFixture->runAllTests();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(2, firstPlugin->postAction);
}